

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O1

void __thiscall rsg::Shader::~Shader(Shader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Function *this_00;
  pointer ppSVar2;
  pointer pcVar3;
  pointer ppSVar4;
  pointer ppFVar5;
  pointer ppSVar6;
  pointer ppFVar7;
  
  ppFVar5 = (this->m_functions).
            super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar7 = (this->m_functions).
                 super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar7 != ppFVar5; ppFVar7 = ppFVar7 + 1) {
    this_00 = *ppFVar7;
    if (this_00 != (Function *)0x0) {
      Function::~Function(this_00);
      operator_delete(this_00,0xe0);
    }
    ppFVar5 = (this->m_functions).
              super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppFVar7 = (this->m_functions).
            super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar5 != ppFVar7) {
    (this->m_functions).super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppFVar7;
  }
  for (ppSVar6 = (this->m_globalStatements).
                 super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar2 = (this->m_globalStatements).
                super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
                super__Vector_impl_data._M_finish, ppSVar6 != ppSVar2; ppSVar6 = ppSVar6 + 1) {
    if (*ppSVar6 != (Statement *)0x0) {
      (*(*ppSVar6)->_vptr_Statement[1])();
    }
  }
  ppSVar6 = (this->m_globalStatements).
            super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != ppSVar6) {
    (this->m_globalStatements).
    super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar6;
  }
  anon_unknown_18::deleteVectorElements<rsg::ShaderInput>(&this->m_inputs);
  anon_unknown_18::deleteVectorElements<rsg::ShaderInput>(&this->m_uniforms);
  pcVar3 = (this->m_source)._M_dataplus._M_p;
  paVar1 = &(this->m_source).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  Function::~Function(&this->m_mainFunction);
  ppFVar7 = (this->m_functions).
            super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar7 != (pointer)0x0) {
    operator_delete(ppFVar7,(long)(this->m_functions).
                                  super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar7
                   );
  }
  ppSVar4 = (this->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->m_uniforms).
                                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  ppSVar4 = (this->m_inputs).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->m_inputs).
                                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  ppSVar6 = (this->m_globalStatements).
            super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar6 != (pointer)0x0) {
    operator_delete(ppSVar6,(long)(this->m_globalStatements).
                                  super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar6
                   );
  }
  VariableScope::~VariableScope(&this->m_globalScope);
  return;
}

Assistant:

Shader::~Shader (void)
{
	deleteVectorElements(m_functions);
	deleteVectorElements(m_globalStatements);
	deleteVectorElements(m_inputs);
	deleteVectorElements(m_uniforms);
}